

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O2

GLenum __thiscall
gl3cts::TextureSizePromotion::FunctionalTest::getDestinationFormatForChannel
          (FunctionalTest *this,TextureInternalFormatDescriptor descriptor)

{
  GLenum GVar1;
  
  GVar1 = 0x822e;
  if (((((descriptor.expected_alpha_type != 0x1406 && descriptor.expected_blue_type != 0x1406) &&
         (descriptor.expected_green_type != 0x1406 && descriptor.expected_red_type != 0x1406)) &&
       (GVar1 = 0x822a,
       (descriptor.expected_alpha_type != 0x8c17 && descriptor.expected_blue_type != 0x8c17) &&
       (descriptor.expected_green_type != 0x8c17 && descriptor.expected_red_type != 0x8c17))) &&
      (GVar1 = 0x8f98,
      (descriptor.expected_alpha_type != 0x8f9c && descriptor.expected_blue_type != 0x8f9c) &&
      (descriptor.expected_green_type != 0x8f9c && descriptor.expected_red_type != 0x8f9c))) &&
     (GVar1 = 0x8236,
     (descriptor.expected_alpha_type != 0x1405 && descriptor.expected_blue_type != 0x1405) &&
     (descriptor.expected_green_type != 0x1405 && descriptor.expected_red_type != 0x1405))) {
    GVar1 = 0x822e;
    if (descriptor.expected_alpha_type == 0x1404) {
      GVar1 = 0x8235;
    }
    if (descriptor.expected_blue_type == 0x1404) {
      GVar1 = 0x8235;
    }
    if (descriptor.expected_green_type == 0x1404) {
      GVar1 = 0x8235;
    }
    if (descriptor.expected_red_type == 0x1404) {
      GVar1 = 0x8235;
    }
  }
  return GVar1;
}

Assistant:

glw::GLenum FunctionalTest::getDestinationFormatForChannel(TextureInternalFormatDescriptor descriptor)
{
	if (isFloatType(descriptor))
	{
		return GL_R32F;
	}

	if (isFixedUnsignedType(descriptor))
	{
		return GL_R16;
	}

	if (isFixedSignedType(descriptor))
	{
		return GL_R16_SNORM;
	}

	if (isIntegerUnsignedType(descriptor))
	{
		return GL_R32UI;
	}

	if (isIntegerSignedType(descriptor))
	{
		return GL_R32I;
	}

	return GL_R32F;
}